

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OjaNewton.cc
# Opt level: O0

void __thiscall OjaNewton::check(OjaNewton *this)

{
  uint uVar1;
  weight *pwVar2;
  long *in_RDI;
  double dVar3;
  int i_6;
  int j_6;
  int h_2;
  int j_5;
  weight *w_1;
  uint32_t i_5;
  int j_4;
  weight *w;
  uint32_t i_4;
  uint32_t length;
  int j_3;
  int h_1;
  int j_2;
  int i_3;
  int i_2;
  int h;
  int i_1;
  int j_1;
  int j;
  int i;
  double max_norm;
  undefined4 in_stack_ffffffffffffff98;
  int iVar4;
  int in_stack_ffffffffffffff9c;
  int local_60;
  int local_5c;
  uint local_50;
  int local_4c;
  uint local_40;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  double local_10;
  
  local_10 = 0.0;
  for (local_14 = 1; local_14 <= (int)in_RDI[1]; local_14 = local_14 + 1) {
    for (local_18 = local_14; local_18 <= (int)in_RDI[1]; local_18 = local_18 + 1) {
      dVar3 = std::fabs((double)(ulong)*(uint *)(*(long *)(in_RDI[8] + (long)local_14 * 8) +
                                                (long)local_18 * 4));
      local_10 = std::fmax<double,float>(local_10,SUB84(dVar3,0));
    }
  }
  if (10000000.0 <= local_10) {
    for (local_1c = 1; local_1c <= (int)in_RDI[1]; local_1c = local_1c + 1) {
      memset((void *)in_RDI[0xb],0,(long)((int)in_RDI[1] + 1) << 3);
      for (local_20 = 1; local_20 <= (int)in_RDI[1]; local_20 = local_20 + 1) {
        for (local_24 = 1; local_24 <= (int)in_RDI[1]; local_24 = local_24 + 1) {
          *(float *)(in_RDI[0xb] + (long)local_20 * 4) =
               *(float *)(*(long *)(in_RDI[7] + (long)local_20 * 8) + (long)local_24 * 4) *
               *(float *)(*(long *)(in_RDI[8] + (long)local_24 * 8) + (long)local_1c * 4) +
               *(float *)(in_RDI[0xb] + (long)local_20 * 4);
        }
      }
      for (local_28 = 1; local_28 <= (int)in_RDI[1]; local_28 = local_28 + 1) {
        *(undefined4 *)(*(long *)(in_RDI[8] + (long)local_28 * 8) + (long)local_1c * 4) =
             *(undefined4 *)(in_RDI[0xb] + (long)local_28 * 4);
      }
    }
    for (local_2c = 1; local_2c <= (int)in_RDI[1]; local_2c = local_2c + 1) {
      memset((void *)in_RDI[0xb],0,(long)((int)in_RDI[1] + 1) << 3);
      for (local_30 = 1; local_30 <= (int)in_RDI[1]; local_30 = local_30 + 1) {
        for (local_34 = 1; local_34 <= (int)in_RDI[1]; local_34 = local_34 + 1) {
          *(float *)(in_RDI[0xb] + (long)local_30 * 4) =
               *(float *)(*(long *)(in_RDI[8] + (long)local_2c * 8) + (long)local_34 * 4) *
               *(float *)(*(long *)(in_RDI[7] + (long)local_30 * 8) + (long)local_34 * 4) +
               *(float *)(in_RDI[0xb] + (long)local_30 * 4);
        }
      }
      for (local_38 = 1; local_38 <= (int)in_RDI[1]; local_38 = local_38 + 1) {
        *(undefined4 *)(*(long *)(in_RDI[8] + (long)local_2c * 8) + (long)local_38 * 4) =
             *(undefined4 *)(in_RDI[0xb] + (long)local_38 * 4);
      }
    }
    uVar1 = 1 << ((byte)*(undefined4 *)(*in_RDI + 0x50) & 0x1f);
    for (local_40 = 0; local_40 < uVar1; local_40 = local_40 + 1) {
      pwVar2 = parameters::strided_index
                         ((parameters *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          (size_t)in_RDI);
      for (local_4c = 1; local_4c <= (int)in_RDI[1]; local_4c = local_4c + 1) {
        *pwVar2 = pwVar2[local_4c] * *(float *)(in_RDI[5] + (long)local_4c * 4) *
                  *(float *)(in_RDI[6] + (long)local_4c * 4) + *pwVar2;
      }
    }
    memset((void *)in_RDI[5],0,(long)((int)in_RDI[1] + 1) << 3);
    for (local_50 = 0; local_50 < uVar1; local_50 = local_50 + 1) {
      memset((void *)in_RDI[0xb],0,(long)((int)in_RDI[1] + 1) << 2);
      pwVar2 = parameters::strided_index
                         ((parameters *)
                          CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                          (size_t)in_RDI);
      for (local_5c = 1; local_5c <= (int)in_RDI[1]; local_5c = local_5c + 1) {
        for (local_60 = 1; local_60 <= (int)in_RDI[1]; local_60 = local_60 + 1) {
          *(float *)(in_RDI[0xb] + (long)local_5c * 4) =
               *(float *)(*(long *)(in_RDI[7] + (long)local_5c * 8) + (long)local_60 * 4) *
               *(float *)(in_RDI[6] + (long)local_60 * 4) * pwVar2[local_60] +
               *(float *)(in_RDI[0xb] + (long)local_5c * 4);
        }
      }
      for (in_stack_ffffffffffffff9c = 1; in_stack_ffffffffffffff9c <= (int)in_RDI[1];
          in_stack_ffffffffffffff9c = in_stack_ffffffffffffff9c + 1) {
        pwVar2[in_stack_ffffffffffffff9c] =
             *(weight *)(in_RDI[0xb] + (long)in_stack_ffffffffffffff9c * 4);
      }
    }
    for (iVar4 = 1; iVar4 <= (int)in_RDI[1]; iVar4 = iVar4 + 1) {
      memset(*(void **)(in_RDI[7] + (long)iVar4 * 8),0,(long)((int)in_RDI[1] + 1) << 3);
      *(undefined4 *)(in_RDI[6] + (long)iVar4 * 4) = 0x3f800000;
      *(undefined4 *)(*(long *)(in_RDI[7] + (long)iVar4 * 8) + (long)iVar4 * 4) = 0x3f800000;
    }
  }
  return;
}

Assistant:

void check()
  {
    double max_norm = 0;
    for (int i = 1; i <= m; i++)
      for (int j = i; j <= m; j++) max_norm = fmax(max_norm, fabs(K[i][j]));
    // printf("|K| = %f\n", max_norm);
    if (max_norm < 1e7)
      return;

    // implicit -> explicit representation
    // printf("begin conversion: t = %d, norm(K) = %f\n", t, max_norm);

    // first step: K <- AKA'

    // K <- AK
    for (int j = 1; j <= m; j++)
    {
      memset(tmp, 0, sizeof(double) * (m + 1));

      for (int i = 1; i <= m; i++)
      {
        for (int h = 1; h <= m; h++)
        {
          tmp[i] += A[i][h] * K[h][j];
        }
      }

      for (int i = 1; i <= m; i++) K[i][j] = tmp[i];
    }
    // K <- KA'
    for (int i = 1; i <= m; i++)
    {
      memset(tmp, 0, sizeof(double) * (m + 1));

      for (int j = 1; j <= m; j++)
        for (int h = 1; h <= m; h++) tmp[j] += K[i][h] * A[j][h];

      for (int j = 1; j <= m; j++)
      {
        K[i][j] = tmp[j];
      }
    }

    // second step: w[0] <- w[0] + (DZ)'b, b <- 0.

    uint32_t length = 1 << all->num_bits;
    for (uint32_t i = 0; i < length; i++)
    {
      weight& w = all->weights.strided_index(i);
      for (int j = 1; j <= m; j++) w += (&w)[j] * b[j] * D[j];
    }

    memset(b, 0, sizeof(double) * (m + 1));

    // third step: Z <- ADZ, A, D <- Identity

    // double norm = 0;
    for (uint32_t i = 0; i < length; ++i)
    {
      memset(tmp, 0, sizeof(float) * (m + 1));
      weight& w = all->weights.strided_index(i);
      for (int j = 1; j <= m; j++)
      {
        for (int h = 1; h <= m; ++h) tmp[j] += A[j][h] * D[h] * (&w)[h];
      }
      for (int j = 1; j <= m; ++j)
      {
        // norm = max(norm, fabs(tmp[j]));
        (&w)[j] = tmp[j];
      }
    }
    // printf("|Z| = %f\n", norm);

    for (int i = 1; i <= m; i++)
    {
      memset(A[i], 0, sizeof(double) * (m + 1));
      D[i] = 1;
      A[i][i] = 1;
    }
  }